

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void fejer2_compute(int n,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *theta;
  double r8_pi;
  double p;
  int j;
  int i;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (0 < n) {
    if (n == 1) {
      *x = 0.0;
      *w = 2.0;
    }
    else if (n == 2) {
      *x = -0.5;
      x[1] = 0.5;
      *w = 1.0;
      w[1] = 1.0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)n;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pvVar3 = operator_new__(uVar2);
      for (p._4_4_ = 1; p._4_4_ <= n; p._4_4_ = p._4_4_ + 1) {
        *(double *)((long)pvVar3 + (long)(p._4_4_ + -1) * 8) =
             ((double)((n + 1) - p._4_4_) * 3.141592653589793) / (double)(n + 1);
      }
      for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
        dVar4 = cos(*(double *)((long)pvVar3 + (long)p._4_4_ * 8));
        x[p._4_4_] = dVar4;
      }
      for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
        w[p._4_4_] = 1.0;
        for (p._0_4_ = 1; p._0_4_ <= (n + -1) / 2; p._0_4_ = p._0_4_ + 1) {
          dVar4 = w[p._4_4_];
          dVar5 = cos((double)p._0_4_ * 2.0 * *(double *)((long)pvVar3 + (long)p._4_4_ * 8));
          w[p._4_4_] = dVar4 - (dVar5 * 2.0) / (double)(p._0_4_ * 4 * p._0_4_ + -1);
        }
        if (2 < n) {
          dVar4 = (double)((n + 1) / 2);
          dVar5 = dVar4 + dVar4 + -1.0;
          dVar4 = w[p._4_4_];
          dVar6 = cos((dVar5 + 1.0) * *(double *)((long)pvVar3 + (long)p._4_4_ * 8));
          w[p._4_4_] = dVar4 - dVar6 / dVar5;
        }
      }
      for (p._4_4_ = 0; p._4_4_ < n; p._4_4_ = p._4_4_ + 1) {
        w[p._4_4_] = (w[p._4_4_] * 2.0) / (double)(n + 1);
      }
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"FEJER2_COMPUTE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
  exit(1);
}

Assistant:

void fejer2_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER2_COMPUTE computes a Fejer type 2 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.
//
//    Thanks to Mike Neish, University of Toronto, for pointing out a
//    memory leak in a previous version of this code, 13 October 2009.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  double p;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER2_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }
  else if ( n == 2 )
  {
    x[0] = -0.5;
    x[1] = +0.5;
    w[0] = 1.0;
    w[1] = 1.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( n + 1 - i ) * r8_pi
               / double( n + 1     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;

    for ( j = 1; j <= ( ( n - 1 ) / 2 ); j++ )
    {
      w[i] = w[i] - 2.0 * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }

    if ( 2 < n )
    {
      p = 2.0 * double( ( n + 1 ) / 2 ) - 1.0;
      w[i] = w[i] - cos ( ( p + 1.0 ) * theta[i] ) / p;
    }

  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n + 1 );
  }

  delete [] theta;

  return;
}